

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_set_session(mbedtls_ssl_context *ssl,mbedtls_ssl_session *session)

{
  int ret;
  mbedtls_ssl_session *session_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((((ssl == (mbedtls_ssl_context *)0x0) || (session == (mbedtls_ssl_session *)0x0)) ||
      (ssl->session_negotiate == (mbedtls_ssl_session *)0x0)) ||
     ((*(uint *)&ssl->conf->field_0x174 & 1) != 0)) {
    ssl_local._4_4_ = -0x7100;
  }
  else {
    ssl_local._4_4_ = ssl_session_copy(ssl->session_negotiate,session);
    if (ssl_local._4_4_ == 0) {
      ssl->handshake->resume = 1;
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_session( mbedtls_ssl_context *ssl, const mbedtls_ssl_session *session )
{
    int ret;

    if( ssl == NULL ||
        session == NULL ||
        ssl->session_negotiate == NULL ||
        ssl->conf->endpoint != MBEDTLS_SSL_IS_CLIENT )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    if( ( ret = ssl_session_copy( ssl->session_negotiate, session ) ) != 0 )
        return( ret );

    ssl->handshake->resume = 1;

    return( 0 );
}